

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void jtalkdll_copyright(void)

{
  fprintf(_stderr,"%s, Open JTalk Dynamic Link Libraries \n","jtalkdll");
  fprintf(_stderr,"version %d.%d.%d revision(%s)\n",0,0,0x43,"6437128");
  fwrite("https://github.com/rosmarinus/jtalkdll.git\n",0x2b,1,_stderr);
  fwrite("Copyright (C) 2020 takayan\n",0x1b,1,_stderr);
  fwrite("All rights reserved.\n",0x15,1,_stderr);
  fputc(10,_stderr);
  Open_JTalk_COPYRIGHT();
  fwrite("PortAudio Portable Real-Time Audio Library\n",0x2b,1,_stderr);
  fwrite("Copyright (c) 1999-2011 Ross Bencina and Phil Burk\n",0x33,1,_stderr);
  fwrite("http://www.portaudio.com/\n",0x1a,1,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

OPENJTALK_CONVENTION jtalkdll_copyright()
{
	fprintf(stderr, u8"%s, Open JTalk Dynamic Link Libraries \n", DLL_NAME);
	if (strlen(GIT_REV))
	{
		fprintf(stderr, u8"version %d.%d.%d revision(%s)\n", VER_MAJOR, VER_MINOR, VER_BUILD, GIT_REV);
	}
	else
	{
		fprintf(stderr, u8"version %d.%d.%d\n", VER_MAJOR, VER_MINOR, VER_BUILD);
	}
	fprintf(stderr, u8"https://github.com/rosmarinus/jtalkdll.git\n");
	fprintf(stderr, u8"Copyright (C) 2020 takayan\n");
	fprintf(stderr, u8"All rights reserved.\n");
	fprintf(stderr, u8"\n");
	Open_JTalk_COPYRIGHT();

	// portaudio
	fprintf(stderr, u8"PortAudio Portable Real-Time Audio Library\n");
	fprintf(stderr, u8"Copyright (c) 1999-2011 Ross Bencina and Phil Burk\n");
	fprintf(stderr, u8"http://www.portaudio.com/\n");
	fprintf(stderr, u8"\n");
}